

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O3

void __thiscall yyFlexLexer::yypop_buffer_state(yyFlexLexer *this)

{
  size_t sVar1;
  
  if ((this->yy_buffer_stack != (yy_buffer_state **)0x0) &&
     (this->yy_buffer_stack[this->yy_buffer_stack_top] != (yy_buffer_state *)0x0)) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[5])(this);
    sVar1 = this->yy_buffer_stack_top;
    this->yy_buffer_stack[sVar1] = (yy_buffer_state *)0x0;
    if (sVar1 == 0) {
      sVar1 = 0;
    }
    else {
      sVar1 = sVar1 - 1;
      this->yy_buffer_stack_top = sVar1;
    }
    if ((this->yy_buffer_stack != (yy_buffer_state **)0x0) &&
       (this->yy_buffer_stack[sVar1] != (yy_buffer_state *)0x0)) {
      yy_load_buffer_state(this);
      this->yy_did_buffer_switch_on_eof = 1;
    }
  }
  return;
}

Assistant:

void yyFlexLexer::yypop_buffer_state (void)
/* %endif */
{
    	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER );
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if ((yy_buffer_stack_top) > 0)
		--(yy_buffer_stack_top);

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state(  );
		(yy_did_buffer_switch_on_eof) = 1;
	}
}